

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O0

void __thiscall
Js::JavascriptStringObject::JavascriptStringObject(JavascriptStringObject *this,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  TypeId TVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  Type local_20;
  Type local_18;
  DynamicType *type_local;
  JavascriptStringObject *this_local;
  
  local_18.ptr = (RuntimeFunction *)type;
  type_local = (DynamicType *)this;
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e3d758;
  local_20.ptr = (GlobalObject *)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierPtr
            (&this->value,&stack0xffffffffffffffe0.ptr);
  TVar4 = Js::Type::GetTypeId((Type *)local_18.ptr);
  if (TVar4 != TypeIds_StringObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptStringObject.cpp"
                                ,0xc,"(type->GetTypeId() == TypeIds_StringObject)",
                                "type->GetTypeId() == TypeIds_StringObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pDVar6 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  DynamicTypeHandler::ClearHasOnlyWritableDataProperties(pDVar6);
  pDVar6 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  bVar3 = DynamicTypeHandler::GetFlags(pDVar6);
  if ((bVar3 & 0x20) != 0) {
    RecyclableObject::GetLibrary((RecyclableObject *)this);
    JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
              ((JavascriptLibrary *)&stack0xffffffffffffffd8);
    this_00 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *
                         )&stack0xffffffffffffffd8);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
  }
  return;
}

Assistant:

JavascriptStringObject::JavascriptStringObject(DynamicType * type)
        : DynamicObject(type), value(nullptr)
    {
        Assert(type->GetTypeId() == TypeIds_StringObject);

        this->GetTypeHandler()->ClearHasOnlyWritableDataProperties(); // length is non-writable
        if(GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag)
        {

            // No need to invalidate store field caches for non-writable properties here. Since this type is just being created, it cannot represent
            // an object that is already a prototype. If it becomes a prototype and then we attempt to add a property to an object derived from this
            // object, then we will check if this property is writable, and only if it is will we do the fast path for add property.
            GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }
    }